

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_unix.cpp
# Opt level: O0

int64_t __thiscall File::seek(File *this,int64_t offset,SeekMethod whence)

{
  bool bVar1;
  int __fd;
  int local_28;
  int sWhence;
  SeekMethod whence_local;
  int64_t offset_local;
  File *this_local;
  
  bVar1 = isOpen(this);
  if (bVar1) {
    local_28 = 0;
    if (whence == smBegin) {
      local_28 = 0;
    }
    else if (whence == smCurrent) {
      local_28 = 1;
    }
    else if (whence == smEnd) {
      local_28 = 2;
    }
    this->m_pos = offset;
    __fd = anon_unknown.dwarf_2ffb82::to_fd(this->m_impl);
    this_local = (File *)lseek64(__fd,offset,local_28);
  }
  else {
    this_local = (File *)0xffffffffffffffff;
  }
  return (int64_t)this_local;
}

Assistant:

int64_t File::seek(const int64_t offset, const SeekMethod whence) const
{
    if (!isOpen())
        return UINT64_C(-1);

    int sWhence = 0;
    switch (whence)
    {
    case SeekMethod::smBegin:
        sWhence = SEEK_SET;
        break;
    case SeekMethod::smCurrent:
        sWhence = SEEK_CUR;
        break;
    case SeekMethod::smEnd:
        sWhence = SEEK_END;
        break;
    }
    m_pos = offset;
    return lseek(to_fd(m_impl), offset, sWhence);
}